

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peleenetssd_seg.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  int iVar2;
  char *pcVar3;
  float fVar4;
  int *piVar5;
  pointer pOVar6;
  void *__ptr;
  Allocator *pAVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  int iVar11;
  float fVar12;
  ulong uVar13;
  size_t sVar14;
  long lVar15;
  float fVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  int baseLine;
  Extractor ex;
  Mat local_388;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  float mean_vals [3];
  float local_2e0;
  int local_2dc;
  Object object;
  Mat local_288;
  Mat image;
  undefined4 local_230;
  int iStack_22c;
  size_t local_228;
  Allocator *local_218;
  long *local_1f0;
  Option local_1d8;
  Net peleenet;
  Mat m;
  int local_88;
  int local_84;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar3 = argv[1];
    std::__cxx11::string::string((string *)&peleenet,pcVar3,(allocator *)&image);
    cv::imread((string *)&m,(int)&peleenet);
    if ((Allocator **)peleenet._vptr_Net != &peleenet.opt.blob_allocator) {
      operator_delete(peleenet._vptr_Net);
    }
    cVar10 = cv::Mat::empty();
    if (cVar10 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288._20_8_ = 0;
      local_288.allocator = (Allocator *)0x0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      ncnn::Net::Net(&peleenet);
      peleenet.opt.use_vulkan_compute = true;
      iVar11 = ncnn::Net::load_param(&peleenet,"pelee.param");
      if ((iVar11 != 0) || (iVar11 = ncnn::Net::load_model(&peleenet,"pelee.bin"), iVar11 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,2,local_84,local_88,0x130,0x130,(Allocator *)0x0);
      mean_vals[0] = 103.9;
      mean_vals[1] = 116.7;
      mean_vals[2] = 123.6;
      norm_vals[0] = 0.017;
      norm_vals[1] = 0.017;
      norm_vals[2] = 0.017;
      ncnn::Mat::substract_mean_normalize((Mat *)&image,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",(Mat *)&image);
      local_388.cstep = 0;
      local_388.data = (Allocator *)0x0;
      local_388.refcount._0_4_ = 0;
      local_388.refcount._4_4_ = 0;
      local_388.elemsize._0_4_ = 0;
      local_388.elemsize._4_1_ = false;
      local_388.elemsize._5_1_ = false;
      local_388.elemsize._6_1_ = false;
      local_388.elemsize._7_1_ = false;
      local_388.elempack = 0;
      local_388.allocator = (Allocator *)0x0;
      local_388.dims = 0;
      local_388.w = 0;
      local_388.h = 0;
      local_388.d = 0;
      local_388.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&local_388,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < local_388.h) {
        lVar21 = 0;
        do {
          lVar15 = local_388.w * lVar21 * CONCAT44(local_388.elemsize._4_4_,(int)local_388.elemsize)
          ;
          object.label = (int)*(float *)((long)(_func_int ***)local_388.data + lVar15);
          object.prob = *(float *)((long)(_func_int ***)local_388.data + lVar15 + 4);
          object.rect.x =
               *(float *)((long)&((Allocator *)((long)local_388.data + 8))->_vptr_Allocator + lVar15
                         ) * (float)local_84;
          object.rect.y =
               *(float *)((long)&((Allocator *)((long)local_388.data + 8))->_vptr_Allocator +
                         lVar15 + 4) * (float)local_88;
          object.rect.width =
               *(float *)((long)&((Allocator *)((long)local_388.data + 0x10))->_vptr_Allocator +
                         lVar15) * (float)local_84 - object.rect.x;
          object.rect.height =
               *(float *)((long)&((Allocator *)((long)local_388.data + 0x10))->_vptr_Allocator +
                         lVar15 + 4) * (float)local_88 - object.rect.y;
          std::vector<Object,_std::allocator<Object>_>::push_back(&objects,&object);
          lVar21 = lVar21 + 1;
        } while (lVar21 < local_388.h);
      }
      object.rect.x = 0.0;
      object.rect.y = 0.0;
      object.rect.width = 0.0;
      object.rect.height = 0.0;
      object.label = 0;
      object.prob = 0.0;
      ncnn::Extractor::extract(&ex,"sigmoid",(Mat *)&object,0);
      ncnn::Option::Option(&local_1d8);
      ncnn::resize_bilinear((Mat *)&object,&local_288,local_84,local_88,&local_1d8);
      piVar5 = (int *)CONCAT44(object.rect.height,object.rect.width);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if ((*piVar5 == 0) && (object.rect._0_8_ != 0)) {
          free((void *)object.rect._0_8_);
        }
      }
      object.rect.x = 0.0;
      object.rect.y = 0.0;
      object.rect.width = 0.0;
      object.rect.height = 0.0;
      object.label = 0;
      object.prob = 0.0;
      piVar5 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_388.allocator == (Allocator *)0x0) {
            if ((Allocator *)local_388.data != (Allocator *)0x0) {
              free(local_388.data);
            }
          }
          else {
            (*(local_388.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_388.cstep = 0;
      local_388.data = (size_t *)0x0;
      local_388.refcount._0_4_ = 0;
      local_388.refcount._4_4_ = 0;
      local_388.elemsize._0_4_ = 0;
      local_388.elemsize._4_1_ = false;
      local_388.elemsize._5_1_ = false;
      local_388.elemsize._6_1_ = false;
      local_388.elemsize._7_1_ = false;
      local_388.elempack = 0;
      local_388.dims = 0;
      local_388.w = 0;
      local_388.h = 0;
      local_388.d = 0;
      local_388.c = 0;
      ncnn::Extractor::~Extractor(&ex);
      piVar5 = (int *)CONCAT44(iStack_22c,local_230);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_218 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_218->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&peleenet);
      iVar9 = local_288.c;
      iVar8 = local_288.h;
      iVar11 = local_288.w;
      pAVar7 = local_288.allocator;
      __ptr = local_288.data;
      piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      uVar13 = (ulong)(uint)local_288.h;
      uVar25 = (ulong)(uint)local_288.c;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar21 = 0;
        uVar24 = 0;
        do {
          pOVar6 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  SUB84((double)*(float *)((long)&(objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->prob +
                                          lVar21),0),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar21),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar21
                                  ));
          local_388.elemsize._0_4_ = 0;
          local_388.elemsize._4_1_ = false;
          local_388.elemsize._5_1_ = false;
          local_388.elemsize._6_1_ = false;
          local_388.elemsize._7_1_ = false;
          local_388.data = (void *)CONCAT44(local_388.data._4_4_,0x3010000);
          local_388.refcount = (int *)&image;
          ex._vptr_Extractor._0_4_ = (int)ROUND(*(float *)((long)&(pOVar6->rect).x + lVar21));
          ex._vptr_Extractor._4_4_ = (int)ROUND(*(float *)((long)&(pOVar6->rect).y + lVar21));
          ex.d._0_4_ = (int)ROUND(*(float *)((long)&(pOVar6->rect).width + lVar21));
          ex.d._4_4_ = (int)ROUND(*(float *)((long)&(pOVar6->rect).height + lVar21));
          peleenet._vptr_Net = (_func_int **)0x406fe00000000000;
          peleenet.opt.lightmode = false;
          peleenet.opt.use_shader_pack8 = false;
          peleenet.opt.use_subgroup_ops = false;
          peleenet.opt.use_reserved_0 = false;
          peleenet.opt.num_threads = 0;
          peleenet.opt.blob_allocator = (Allocator *)0x0;
          peleenet.opt.workspace_allocator = (Allocator *)0x0;
          cv::rectangle(&local_388,&ex,&peleenet,1,8,0);
          sprintf((char *)&peleenet,"%s %.1f%%",
                  SUB84((double)(*(float *)((long)&pOVar6->prob + lVar21) * 100.0),0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEN4ncnn3MatEE11class_names_rel
                  + *(int *)(
                            _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEN4ncnn3MatEE11class_names_rel
                            + (long)*(int *)((long)&pOVar6->label + lVar21) * 4));
          local_388.data = &local_388.elemsize;
          sVar14 = strlen((char *)&peleenet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_388,&peleenet,(long)&peleenet._vptr_Net + sVar14);
          cv::getTextSize((string *)norm_vals,(int)&local_388,0.5,0,(int *)0x1);
          if ((size_t *)local_388.data != &local_388.elemsize) {
            operator_delete(local_388.data);
          }
          fVar12 = (float)(int)*(float *)((long)&(pOVar6->rect).x + lVar21);
          fVar16 = (float)(int)((*(float *)((long)&(pOVar6->rect).y + lVar21) -
                                (float)(int)norm_vals[1]) - 0.0);
          if ((int)fVar16 < 1) {
            fVar16 = 0.0;
          }
          fVar4 = (float)(iStack_22c - (int)norm_vals[0]);
          if ((int)norm_vals[0] + (int)fVar12 <= iStack_22c) {
            fVar4 = fVar12;
          }
          local_1d8.workspace_allocator = (Allocator *)0x0;
          local_1d8.lightmode = false;
          local_1d8.use_shader_pack8 = false;
          local_1d8.use_subgroup_ops = true;
          local_1d8.use_reserved_0 = true;
          local_1d8.blob_allocator = (Allocator *)&image;
          mean_vals[1] = fVar16;
          mean_vals[0] = fVar4;
          mean_vals[2] = norm_vals[0];
          local_388.data = (Allocator *)0x406fe00000000000;
          local_388.refcount._0_4_ = 0;
          local_388.refcount._4_4_ = 0x406fe000;
          local_388.elemsize._0_4_ = 0;
          local_388.elemsize._4_1_ = false;
          local_388.elemsize._5_1_ = true;
          local_388.elemsize._6_1_ = true;
          local_388.elemsize._7_1_ = true;
          local_388.elempack = 0;
          local_388._28_4_ = 0;
          cv::rectangle(&local_1d8,mean_vals,&local_388,0xffffffff,8,0);
          local_1d8.workspace_allocator = (Allocator *)0x0;
          local_1d8.lightmode = false;
          local_1d8.use_shader_pack8 = false;
          local_1d8.use_subgroup_ops = true;
          local_1d8.use_reserved_0 = true;
          local_1d8.blob_allocator = (Allocator *)&image;
          local_388.data = &local_388.elemsize;
          sVar14 = strlen((char *)&peleenet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_388,&peleenet,(long)&peleenet._vptr_Net + sVar14);
          local_2dc = (int)fVar16 + (int)norm_vals[1];
          object.rect.x = 0.0;
          object.rect.y = 0.0;
          object.rect.width = 0.0;
          object.rect.height = 0.0;
          object.label = 0;
          object.prob = 0.0;
          local_2e0 = fVar4;
          cv::putText(0,&local_1d8,&local_388,&local_2e0,0,&object,1,8,0);
          if ((size_t *)local_388.data != &local_388.elemsize) {
            operator_delete(local_388.data);
          }
          uVar24 = uVar24 + 1;
          lVar21 = lVar21 + 0x18;
        } while (uVar24 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      if (0 < iVar8) {
        uVar24 = 0;
        lVar21 = 0;
        do {
          if (0 < iVar11) {
            lVar15 = *local_1f0 * uVar24 + local_228;
            lVar21 = (long)(int)lVar21;
            lVar17 = 0;
            iVar18 = 0;
            do {
              if (iVar9 < 1) {
                uVar19 = 0xffffffff;
              }
              else {
                uVar20 = 0xffffffff;
                iVar23 = 0;
                uVar22 = 0;
                fVar12 = 0.45;
                do {
                  fVar16 = *(float *)((long)__ptr + (long)iVar23 * 4 + lVar21 * 4);
                  if (fVar12 < fVar16) {
                    uVar20 = uVar22 & 0xffffffff;
                    fVar12 = fVar16;
                  }
                  uVar19 = (uint)uVar20;
                  uVar22 = uVar22 + 1;
                  iVar23 = iVar23 + iVar8 * iVar11;
                } while (uVar25 != uVar22);
              }
              if (uVar19 < 2) {
                uVar20 = (ulong)(uVar19 * 3);
                iVar23 = *(int *)(&DAT_005ef1c4 + uVar20 * 4);
                iVar2 = *(int *)(&DAT_005ef1c8 + uVar20 * 4);
                *(byte *)(lVar15 + lVar17) =
                     (char)((uint)(*(int *)(&DAT_005ef1c0 + uVar20 * 4) -
                                  (*(int *)(&DAT_005ef1c0 + uVar20 * 4) >> 0x1f)) >> 1) +
                     (*(byte *)(lVar15 + lVar17) >> 1);
                *(byte *)(lVar15 + 1 + lVar17) =
                     (char)((uint)(iVar23 - (iVar23 >> 0x1f)) >> 1) +
                     (*(byte *)(lVar15 + 1 + lVar17) >> 1);
                *(byte *)(lVar15 + 2 + lVar17) =
                     (char)((uint)(iVar2 - (iVar2 >> 0x1f)) >> 1) +
                     (*(byte *)(lVar15 + 2 + lVar17) >> 1);
              }
              lVar17 = lVar17 + 3;
              lVar21 = lVar21 + 1;
              iVar18 = iVar18 + 1;
            } while (iVar18 != iVar11);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar13);
      }
      ppAVar1 = &peleenet.opt.blob_allocator;
      peleenet.opt.blob_allocator =
           (Allocator *)CONCAT26(peleenet.opt.blob_allocator._6_2_,0x6567616d69);
      peleenet.opt.lightmode = true;
      peleenet.opt.use_shader_pack8 = false;
      peleenet.opt.use_subgroup_ops = false;
      peleenet.opt.use_reserved_0 = false;
      peleenet.opt.num_threads = 0;
      local_388.elemsize._0_4_ = 0;
      local_388.elemsize._4_1_ = false;
      local_388.elemsize._5_1_ = false;
      local_388.elemsize._6_1_ = false;
      local_388.elemsize._7_1_ = false;
      local_388.data = (void *)CONCAT44(local_388.data._4_4_,0x1010000);
      local_388.refcount = (int *)&image;
      peleenet._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&peleenet,(_InputArray *)&local_388);
      if ((Allocator **)peleenet._vptr_Net != ppAVar1) {
        operator_delete(peleenet._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (pAVar7 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar7->_vptr_Allocator[3])(pAVar7,__ptr);
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_288.allocator == (Allocator *)0x0) {
            if (local_288.data != (void *)0x0) {
              free(local_288.data);
            }
          }
          else {
            (*(local_288.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_288.cstep = 0;
      local_288.data = (void *)0x0;
      local_288.refcount._0_4_ = 0;
      local_288.refcount._4_4_ = 0;
      local_288.elemsize._0_4_ = 0;
      local_288._20_8_ = 0;
      local_288.dims = 0;
      local_288.w = 0;
      local_288.h = 0;
      local_288.d = 0;
      local_288.c = 0;
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar11 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar3);
      iVar11 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar11 = -1;
  }
  return iVar11;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    ncnn::Mat seg_out;
    detect_peleenet(m, objects, seg_out);

    draw_objects(m, objects, seg_out);

    return 0;
}